

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::CopyClassExpression::fromSyntax
          (Compilation *compilation,CopyClassExpressionSyntax *syntax,ASTContext *context)

{
  ExpressionSyntax *syntax_00;
  Type *pTVar1;
  bool bVar2;
  Expression *pEVar3;
  CopyClassExpression *expr;
  Type *pTVar4;
  Diagnostic *diag;
  char *func;
  SourceRange local_38;
  
  syntax_00 = (syntax->expr).ptr;
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
  }
  else {
    pEVar3 = Expression::selfDetermined
                       (compilation,syntax_00,context,(bitmask<slang::ast::ASTFlags>)0x0);
    pTVar1 = (pEVar3->type).ptr;
    if (pTVar1 != (Type *)0x0) {
      local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      expr = BumpAllocator::
             emplace<slang::ast::CopyClassExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,pTVar1,pEVar3,&local_38);
      bVar2 = Expression::bad(pEVar3);
      if (bVar2) {
LAB_003bd068:
        pEVar3 = Expression::badExpr(compilation,&expr->super_Expression);
        return pEVar3;
      }
      pTVar1 = (pEVar3->type).ptr;
      if (pTVar1 != (Type *)0x0) {
        pTVar4 = pTVar1->canonical;
        if (pTVar4 == (Type *)0x0) {
          Type::resolveCanonical(pTVar1);
          pTVar4 = pTVar1->canonical;
        }
        if ((pTVar4->super_Symbol).kind == ClassType) {
          return &expr->super_Expression;
        }
        diag = ASTContext::addDiag(context,(DiagCode)0x3c0007,pEVar3->sourceRange);
        pTVar1 = (pEVar3->type).ptr;
        if (pTVar1 != (Type *)0x0) {
          ast::operator<<(diag,pTVar1);
          goto LAB_003bd068;
        }
      }
    }
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& CopyClassExpression::fromSyntax(Compilation& compilation,
                                            const CopyClassExpressionSyntax& syntax,
                                            const ASTContext& context) {
    auto& source = selfDetermined(compilation, *syntax.expr, context);
    auto result = compilation.emplace<CopyClassExpression>(*source.type, source,
                                                           syntax.sourceRange());
    if (source.bad())
        return badExpr(compilation, result);

    if (!source.type->isClass()) {
        context.addDiag(diag::CopyClassTarget, source.sourceRange) << *source.type;
        return badExpr(compilation, result);
    }

    return *result;
}